

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac_drbg.c
# Opt level: O0

int mbedtls_hmac_drbg_random_with_add
              (void *p_rng,uchar *output,size_t out_len,uchar *additional,size_t add_len)

{
  byte bVar1;
  int iVar2;
  uchar *ilen;
  uchar *local_70;
  size_t use_len;
  uchar *out;
  size_t left;
  size_t md_len;
  mbedtls_hmac_drbg_context *ctx;
  size_t sStack_38;
  int ret;
  size_t add_len_local;
  uchar *additional_local;
  size_t out_len_local;
  uchar *output_local;
  void *p_rng_local;
  
  bVar1 = mbedtls_md_get_size(*p_rng);
  ilen = (uchar *)(ulong)bVar1;
  if (out_len < 0x401) {
    if (add_len < 0x101) {
      sStack_38 = add_len;
      if ((*(long *)((long)p_rng + 0x70) != 0) &&
         ((*(int *)((long)p_rng + 0x68) == 1 ||
          (*(int *)((long)p_rng + 0x6c) < *(int *)((long)p_rng + 0x58))))) {
        iVar2 = mbedtls_hmac_drbg_reseed((mbedtls_hmac_drbg_context *)p_rng,additional,add_len);
        if (iVar2 != 0) {
          return iVar2;
        }
        sStack_38 = 0;
      }
      use_len = (size_t)output;
      out = (uchar *)out_len;
      if ((additional != (uchar *)0x0) && (sStack_38 != 0)) {
        mbedtls_hmac_drbg_update((mbedtls_hmac_drbg_context *)p_rng,additional,sStack_38);
      }
      for (; out != (uchar *)0x0; out = out + -(long)local_70) {
        local_70 = ilen;
        if (out <= ilen) {
          local_70 = out;
        }
        mbedtls_md_hmac_reset((mbedtls_md_context_t *)p_rng);
        mbedtls_md_hmac_update
                  ((mbedtls_md_context_t *)p_rng,(uchar *)((long)p_rng + 0x18),(size_t)ilen);
        mbedtls_md_hmac_finish((mbedtls_md_context_t *)p_rng,(uchar *)((long)p_rng + 0x18));
        memcpy((void *)use_len,(void *)((long)p_rng + 0x18),(size_t)local_70);
        use_len = (size_t)(local_70 + use_len);
      }
      mbedtls_hmac_drbg_update((mbedtls_hmac_drbg_context *)p_rng,additional,sStack_38);
      *(int *)((long)p_rng + 0x58) = *(int *)((long)p_rng + 0x58) + 1;
      p_rng_local._4_4_ = 0;
    }
    else {
      p_rng_local._4_4_ = -5;
    }
  }
  else {
    p_rng_local._4_4_ = -3;
  }
  return p_rng_local._4_4_;
}

Assistant:

int mbedtls_hmac_drbg_random_with_add( void *p_rng,
                               unsigned char *output, size_t out_len,
                               const unsigned char *additional, size_t add_len )
{
    int ret;
    mbedtls_hmac_drbg_context *ctx = (mbedtls_hmac_drbg_context *) p_rng;
    size_t md_len = mbedtls_md_get_size( ctx->md_ctx.md_info );
    size_t left = out_len;
    unsigned char *out = output;

    /* II. Check request length */
    if( out_len > MBEDTLS_HMAC_DRBG_MAX_REQUEST )
        return( MBEDTLS_ERR_HMAC_DRBG_REQUEST_TOO_BIG );

    /* III. Check input length */
    if( add_len > MBEDTLS_HMAC_DRBG_MAX_INPUT )
        return( MBEDTLS_ERR_HMAC_DRBG_INPUT_TOO_BIG );

    /* 1. (aka VII and IX) Check reseed counter and PR */
    if( ctx->f_entropy != NULL && /* For no-reseeding instances */
        ( ctx->prediction_resistance == MBEDTLS_HMAC_DRBG_PR_ON ||
          ctx->reseed_counter > ctx->reseed_interval ) )
    {
        if( ( ret = mbedtls_hmac_drbg_reseed( ctx, additional, add_len ) ) != 0 )
            return( ret );

        add_len = 0; /* VII.4 */
    }

    /* 2. Use additional data if any */
    if( additional != NULL && add_len != 0 )
        mbedtls_hmac_drbg_update( ctx, additional, add_len );

    /* 3, 4, 5. Generate bytes */
    while( left != 0 )
    {
        size_t use_len = left > md_len ? md_len : left;

        mbedtls_md_hmac_reset( &ctx->md_ctx );
        mbedtls_md_hmac_update( &ctx->md_ctx, ctx->V, md_len );
        mbedtls_md_hmac_finish( &ctx->md_ctx, ctx->V );

        memcpy( out, ctx->V, use_len );
        out += use_len;
        left -= use_len;
    }

    /* 6. Update */
    mbedtls_hmac_drbg_update( ctx, additional, add_len );

    /* 7. Update reseed counter */
    ctx->reseed_counter++;

    /* 8. Done */
    return( 0 );
}